

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O2

void ansv<unsigned_long,0,2,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  int iVar1;
  int iVar2;
  pointer ppVar3;
  ulong uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  pointer puVar7;
  uint __line;
  unsigned_long *puVar8;
  _Map_pointer pppVar9;
  long lVar10;
  size_type sVar11;
  _Elt_pointer ppVar12;
  size_type sVar13;
  long lVar14;
  _Elt_pointer ppVar15;
  _Elt_pointer ppVar16;
  _Map_pointer pppVar17;
  _Elt_pointer ppVar18;
  size_t rcv_idx;
  unsigned_long uVar19;
  char *__assertion;
  ulong uVar20;
  size_t i_1;
  long lVar21;
  pointer ppVar22;
  ulong uVar23;
  _Elt_pointer ppVar24;
  ulong uVar25;
  size_t i;
  ulong uVar26;
  reverse_iterator it2;
  size_t local_size;
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  q;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_160;
  unsigned_long local_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_d8;
  _Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>
  local_b8;
  _Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>
  local_98;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_Deque_base(&q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               );
  local_size = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start >> 3;
  local_140 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_size,comm);
  lVar10 = local_140 - 1;
  lVar14 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
LAB_0013f291:
  lVar21 = lVar14 + -1;
  if (lVar14 != 0) {
    while (q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ppVar24 = q.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar24 = q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      if (ppVar24[-1].first <=
          (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar21]) break;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back(&q);
    }
    do {
      sVar11 = std::
               deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::size(&q);
      if (sVar11 < 2) goto LAB_0013f384;
      ppVar24 = q.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar24 = q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      uVar19 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar21];
      if (uVar19 != ppVar24[-1].first) goto LAB_0013f384;
      local_160.current._M_cur =
           q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      local_160.current._M_first =
           q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_160.current._M_last =
           q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_last;
      local_160.current._M_node =
           q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node;
      std::
      reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
      ::operator+((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                   *)&it2,&local_160,1);
      ppVar24 = it2.current._M_cur;
      if (it2.current._M_cur == it2.current._M_first) {
        ppVar24 = it2.current._M_node[-1] + 0x20;
      }
      if (uVar19 != ppVar24[-1].first) goto LAB_0013f384;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back(&q);
    } while( true );
  }
  local_58.current._M_cur =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&it2,&local_58,&local_78,(allocator_type *)&local_160);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_move_assign(lr_mins,&it2);
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)&it2);
  sVar11 = std::
           deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::size(&q);
  if (sVar11 == 0) {
    __assertion = "n_left_mins >= 1";
    __line = 0x60;
  }
  else {
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::clear(&q);
    uVar26 = 0;
LAB_0013f444:
    if (uVar26 < (ulong)((long)(in->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(in->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3)) {
      while (q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar24 = q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar24 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar24[-1].first <=
            (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar26]) break;
        std::
        deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::pop_back(&q);
      }
      do {
        ppVar24 = (_Elt_pointer)
                  (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar26];
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0013f4e1;
        ppVar12 = q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar12 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar24 != (_Elt_pointer)ppVar12[-1].first) goto LAB_0013f4e1;
        std::
        deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::pop_back(&q);
      } while( true );
    }
    sVar13 = std::
             deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::size(&q);
    local_98._M_cur =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_98._M_first =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    local_98._M_last =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_98._M_node =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_b8._M_cur =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_b8._M_first =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_b8._M_last =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_b8._M_node =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::
    insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>,void>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)lr_mins,
               (lr_mins->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,&local_98,&local_b8);
    local_min = (q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
    if (sVar13 == 0) {
      __assertion = "n_right_mins >= 1";
      __line = 0x76;
      goto LAB_0013fd95;
    }
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::clear(&q);
    if (sVar13 + sVar11 ==
        (long)(lr_mins->
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(lr_mins->
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 4) {
      mxx::allgather<unsigned_long>(&allmins,&local_min,comm);
      it2.current._M_cur = (_Elt_pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&send_counts,(long)comm->m_size,(value_type_conflict *)&it2,
                 (allocator_type *)&local_160);
      it2.current._M_cur = (_Elt_pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&send_displs,(long)comm->m_size,(value_type_conflict *)&it2,
                 (allocator_type *)&local_160);
      iVar1 = comm->m_rank;
      lVar14 = (long)iVar1;
      if (0 < lVar14) {
        ppVar3 = (lr_mins->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar25 = 0;
        lVar10 = lVar14;
        uVar26 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14 + -1];
        do {
          do {
            if (lVar10 < 1) goto LAB_0013f6cf;
            uVar20 = uVar25;
            if ((uVar25 != 0 && lVar10 < lVar14) &&
               (uVar20 = uVar25 - 1, uVar26 < ppVar3[uVar25 - 1].first)) {
              uVar20 = uVar25;
            }
            lVar10 = lVar10 + -1;
            uVar4 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar10];
            uVar23 = uVar25;
            ppVar22 = (lr_mins->
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar25;
            do {
              uVar25 = uVar23;
              if (sVar11 <= uVar25 + 1) break;
              puVar8 = &ppVar22->first;
              uVar23 = uVar25 + 1;
              ppVar22 = ppVar22 + 1;
            } while (uVar4 <= *puVar8);
          } while (uVar26 < uVar4);
          send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] = (uVar25 - uVar20) + 1;
          send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] = uVar20;
          uVar26 = uVar4;
        } while (local_min <=
                 allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10]);
      }
LAB_0013f6cf:
      iVar2 = comm->m_size;
      if (iVar1 < iVar2 + -1) {
        ppVar3 = (lr_mins->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        sVar13 = ((long)(lr_mins->
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 4) - 1;
        uVar26 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14 + 1];
        do {
          do {
            uVar25 = sVar13;
            lVar14 = lVar14 + 1;
            if (iVar2 <= lVar14) goto LAB_0013f776;
            uVar20 = uVar25;
            if (sVar11 < uVar25) {
              uVar20 = sVar11;
            }
            uVar4 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar14];
            uVar23 = uVar25;
            for (ppVar22 = ppVar3 + uVar25;
                (sVar13 = uVar20, sVar11 < uVar23 && (sVar13 = uVar23, uVar4 <= ppVar22->first));
                ppVar22 = ppVar22 + -1) {
              uVar23 = uVar23 - 1;
            }
          } while (uVar26 < uVar4);
          send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar14] = (uVar25 - sVar13) + 1;
          send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar14] = sVar13;
          uVar26 = uVar4;
        } while (local_min <=
                 allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14]);
      }
LAB_0013f776:
      mxx::all2all<unsigned_long>(&recv_counts,&send_counts,comm);
      mxx::impl::get_displacements<unsigned_long>(&recv_displs,&recv_counts);
      uVar19 = recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_finish[-1];
      uVar5 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::vector(&recved,uVar19 + uVar5,(allocator_type *)&it2);
      mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
                ((lr_mins->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,&send_counts,&send_displs,
                 recved.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,&recv_counts,&recv_displs,comm);
      uVar6 = recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm->m_rank];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,local_size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(right_nsv,local_size);
      uVar26 = (uVar19 + uVar5) - uVar6;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::clear(&q);
      lVar14 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
      ppVar24 = (_Elt_pointer)(lVar14 >> 3);
      while( true ) {
        ppVar24 = (_Elt_pointer)((long)&ppVar24[-1].second + 7);
        lVar14 = lVar14 + -8;
        if (ppVar24 == (_Elt_pointer)0xffffffffffffffff) break;
        update_nsv_queue<unsigned_long,0>
                  (left_nsv,&q,
                   (unsigned_long *)
                   ((long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar14),(size_t)ppVar24,0);
        it2.current._M_cur =
             (_Elt_pointer)
             (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[(long)ppVar24];
        it2.current._M_first = ppVar24;
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&q,(pair<unsigned_long,_unsigned_long> *)&it2);
      }
      lVar14 = uVar6 << 4;
      uVar19 = uVar6;
      while( true ) {
        uVar19 = uVar19 - 1;
        if ((uVar19 == 0xffffffffffffffff) ||
           (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur)) break;
        update_nsv_queue<unsigned_long,0>
                  (left_nsv,&q,
                   (unsigned_long *)
                   ((long)&recved.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].first + lVar14),
                   local_size + uVar19,0);
        lVar14 = lVar14 + -0x10;
      }
      puVar7 = (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pppVar17 = q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ppVar12 = q.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first;
      for (ppVar24 = q.
                     super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          ppVar24 !=
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur; ppVar24 = ppVar24 + -1) {
        if (ppVar24 == ppVar12) {
          ppVar12 = pppVar17[-1];
          pppVar17 = pppVar17 + -1;
          puVar7[ppVar12[0x1f].second] = nonsv;
          ppVar24 = ppVar12 + 0x20;
        }
        else {
          puVar7[ppVar24[-1].second] = nonsv;
        }
      }
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::clear(&q);
      for (ppVar24 = (_Elt_pointer)0x0;
          puVar7 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start,
          ppVar24 < (_Elt_pointer)
                    ((long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3);
          ppVar24 = (_Elt_pointer)((long)&ppVar24->first + 1)) {
        update_nsv_queue<unsigned_long,2>(right_nsv,&q,puVar7 + (long)ppVar24,(size_t)ppVar24,0);
        it2.current._M_cur =
             (_Elt_pointer)
             (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[(long)ppVar24];
        it2.current._M_first = ppVar24;
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&q,(pair<unsigned_long,_unsigned_long> *)&it2);
      }
      uVar25 = 0;
      do {
        if ((uVar26 <= uVar25) ||
           (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
          ppVar24 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first;
          pppVar17 = q.
                     super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar12 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          do {
            ppVar15 = ppVar12;
            ppVar18 = ppVar24;
            ppVar16 = q.
                      super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last;
            pppVar9 = pppVar17;
            if (ppVar12 ==
                q.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::operator=(lr_mins,&recved);
              std::
              _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::~_Vector_base(&recved.
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             );
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&recv_displs.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&recv_counts.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&send_displs.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&send_counts.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
              ;
              std::
              _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::~_Deque_base(&q.
                              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            );
              return;
            }
            while (it2.current._M_node = pppVar9, it2.current._M_last = ppVar16,
                  it2.current._M_first = ppVar18, it2.current._M_cur = ppVar15,
                  std::
                  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                  ::operator+(&local_160,&it2,1),
                  local_160.current._M_cur !=
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              ppVar15 = ppVar12;
              if (ppVar12 == ppVar24) {
                ppVar15 = pppVar17[-1] + 0x20;
              }
              uVar19 = ppVar15[-1].first;
              std::
              reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
              ::operator+(&local_d8,&it2,1);
              ppVar15 = local_d8.current._M_cur;
              if (local_d8.current._M_cur == local_d8.current._M_first) {
                ppVar15 = local_d8.current._M_node[-1] + 0x20;
              }
              if (uVar19 != ppVar15[-1].first) break;
              if (it2.current._M_cur == it2.current._M_first) {
                it2.current._M_first = it2.current._M_node[-1];
                it2.current._M_cur = it2.current._M_first + 0x20;
                it2.current._M_last = it2.current._M_cur;
                it2.current._M_node = it2.current._M_node + -1;
              }
              ppVar15 = it2.current._M_cur + -1;
              ppVar18 = ppVar12;
              if (ppVar12 == ppVar24) {
                ppVar18 = pppVar17[-1] + 0x20;
              }
              ppVar16 = ppVar15;
              if (ppVar15 == it2.current._M_first) {
                ppVar16 = it2.current._M_node[-1] + 0x20;
              }
              (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start[ppVar16[-1].second] = ppVar18[-1].second;
              ppVar18 = it2.current._M_first;
              ppVar16 = it2.current._M_last;
              pppVar9 = it2.current._M_node;
            }
            if (ppVar12 == ppVar24) {
              ppVar12 = pppVar17[-1] + 0x20;
            }
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar12[-1].second] = nonsv;
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_last = it2.current._M_last;
            ppVar24 = it2.current._M_first;
            pppVar17 = it2.current._M_node;
            ppVar12 = it2.current._M_cur;
            if (it2.current._M_cur == it2.current._M_first) {
              q.
              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last = it2.current._M_node[-1] + 0x20;
              ppVar24 = it2.current._M_node[-1];
              pppVar17 = it2.current._M_node + -1;
              ppVar12 = q.
                        super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_last;
            }
            ppVar12 = ppVar12 + -1;
          } while( true );
        }
        lVar14 = uVar6 + uVar25;
        update_nsv_queue<unsigned_long,2>
                  (right_nsv,&q,
                   &recved.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar14].first,lVar14 + local_size,0);
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          ppVar24 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (q.
              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              q.
              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar24 = q.
                      super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          lVar10 = lVar14 * 0x10;
          uVar20 = uVar25;
          if (recved.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14].first == ppVar24[-1].first) {
            do {
              uVar25 = uVar20;
              lVar14 = lVar10;
              if (uVar26 <= uVar25 + 1) break;
              lVar10 = lVar14 + 0x10;
              uVar20 = uVar25 + 1;
            } while (*(long *)((long)&(recved.
                                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->first + lVar14)
                     == *(long *)((long)&recved.
                                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1].first + lVar14
                                 ));
            while (q.
                   super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                   q.
                   super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              ppVar24 = q.
                        super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar24 = q.
                          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              if (ppVar24[-1].first !=
                  *(unsigned_long *)
                   ((long)&(recved.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first + lVar14)) break;
              ppVar24 = q.
                        super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar24 = q.
                          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start[ppVar24[-1].second] = local_size + uVar6 + uVar25;
              std::
              deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::pop_back(&q);
            }
          }
        }
        uVar25 = uVar25 + 1;
      } while( true );
    }
    __assertion = "n_right_mins + n_left_mins == lr_mins.size()";
    __line = 0x78;
  }
LAB_0013fd95:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                ,__line,
                "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 0, right_type = 2, indexing_type = 1]"
               );
LAB_0013f384:
  it2.current._M_first = (_Elt_pointer)(lVar14 + lVar10);
  it2.current._M_cur =
       (_Elt_pointer)
       (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start[lVar21];
  std::
  deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::emplace_back<std::pair<unsigned_long,unsigned_long>>
            ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&q,(pair<unsigned_long,_unsigned_long> *)&it2);
  lVar14 = lVar21;
  goto LAB_0013f291;
LAB_0013f4e1:
  it2.current._M_first = (_Elt_pointer)(local_140 + uVar26);
  it2.current._M_cur = ppVar24;
  std::
  deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::emplace_back<std::pair<unsigned_long,unsigned_long>>
            ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&q,(pair<unsigned_long,_unsigned_long> *)&it2);
  uVar26 = uVar26 + 1;
  goto LAB_0013f444;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}